

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::ReservedNamesTest::isStructAllowed
          (ReservedNamesTest *this,_shader_type shader_type,_language_feature language_feature)

{
  bool bVar1;
  
  bVar1 = true;
  if ((language_feature != LANGUAGE_FEATURE_UNIFORM) &&
     (language_feature != LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)) {
    if (shader_type - LANGUAGE_FEATURE_CONSTANT < 3) {
      language_feature = language_feature & ~LANGUAGE_FEATURE_FUNCTION_NAME;
    }
    else {
      if (shader_type == LANGUAGE_FEATURE_INPUT) {
        return language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME;
      }
      if (shader_type != LANGUAGE_FEATURE_ATTRIBUTE) {
        return false;
      }
    }
    bVar1 = language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME;
  }
  return bVar1;
}

Assistant:

bool ReservedNamesTest::isStructAllowed(_shader_type shader_type, _language_feature language_feature) const
{
	bool structAllowed = false;

	if (language_feature == LANGUAGE_FEATURE_UNIFORM || language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)
	{
		return true;
	}

	switch (shader_type)
	{
	case SHADER_TYPE_FRAGMENT:
	{
		if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
	}
	break;
	case SHADER_TYPE_GEOMETRY:
	case SHADER_TYPE_TESS_CONTROL:
	case SHADER_TYPE_TESS_EVALUATION:
	{
		if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
		else if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
	}
	break;
	case SHADER_TYPE_VERTEX:
	{
		if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
	}
	break;
	case SHADER_TYPE_COMPUTE:
	default:
		break;
	}

	return structAllowed;
}